

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void __thiscall
tcmalloc::DefaultPagesAllocator::UnMapPages(DefaultPagesAllocator *this,void *region,size_t size)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uStack_20;
  
  sVar2 = cached_pagesize();
  if ((ulong)region % sVar2 == 0) {
    if (size % sVar2 == 0) {
      iVar1 = munmap(region,size);
      if (iVar1 == 0) {
        return;
      }
      pcVar3 = 
      "Check failed: munmap_result == 0: LowLevelAlloc::DeleteArena: munmap failed address\n";
      uStack_20 = 0x54;
    }
    else {
      pcVar3 = "Check failed: size % pagesize == 0: empty arena has non-page-aligned size\n";
      uStack_20 = 0x4a;
    }
  }
  else {
    pcVar3 = 
    "Check failed: reinterpret_cast<intptr_t>(region) % pagesize == 0: empty arena has non-page-aligned block\n"
    ;
    uStack_20 = 0x69;
  }
  syscall(1,2,pcVar3,uStack_20);
  abort();
}

Assistant:

void DefaultPagesAllocator::UnMapPages(void *region, size_t size) {
  size_t pagesize = cached_pagesize();
  (void)pagesize;

  RAW_CHECK(reinterpret_cast<intptr_t>(region) % pagesize == 0,
            "empty arena has non-page-aligned block");
  RAW_CHECK(size % pagesize == 0,
            "empty arena has non-page-aligned size");

  int munmap_result = munmap(region, size);
  RAW_CHECK(munmap_result == 0,
            "LowLevelAlloc::DeleteArena: munmap failed address");
}